

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void move_map(tgestate_t *state)

{
  byte bVar1;
  long in_RDI;
  pos8_t game_window_offset;
  uint8_t y;
  uint8_t x;
  uint8_t move_map_y;
  direction_t map_direction;
  uint8_t animindex;
  anim_t *anim;
  undefined2 local_17;
  char local_15;
  char local_14;
  byte local_12;
  
  if ((*(char *)(in_RDI + 0x120) == '\0') && ((*(byte *)(in_RDI + 0x3c7) & 0x40) == 0)) {
    local_12 = *(byte *)(*(long *)(in_RDI + 0x3d0) + 3);
    if (local_12 != 0xff) {
      if ((*(byte *)(in_RDI + 0x3d8) & 0x80) != 0) {
        local_12 = local_12 ^ 2;
      }
      local_15 = '|';
      local_14 = '\0';
      if (1 < local_12) {
        local_15 = '\0';
      }
      if ((local_12 != 1) && (local_12 != 2)) {
        local_14 = -0x40;
      }
      if ((*(char *)(in_RDI + 0x691) != local_14) && (*(char *)(in_RDI + 0x692) != local_15)) {
        if (local_12 < 2) {
          *(char *)(in_RDI + 0x70b) = *(char *)(in_RDI + 0x70b) + '\x01';
        }
        else {
          *(char *)(in_RDI + 0x70b) = *(char *)(in_RDI + 0x70b) + -1;
        }
        *(byte *)(in_RDI + 0x70b) = *(byte *)(in_RDI + 0x70b) & 3;
        bVar1 = *(byte *)(in_RDI + 0x70b);
        switch(bVar1) {
        case 0:
          local_17 = 0;
          break;
        case 1:
          local_17 = 0xff30;
          break;
        case 2:
          local_17 = 0x60;
          break;
        case 3:
          local_17 = 0xff90;
        }
        *(undefined2 *)(in_RDI + 0x70c) = local_17;
        switch(local_12) {
        case 0:
          if (bVar1 == 0) {
            shunt_map_up((tgestate_t *)0x107737);
          }
          else if ((bVar1 & 1) != 0) {
            shunt_map_left((tgestate_t *)0x107750);
          }
          break;
        case 1:
          if (bVar1 == 0) {
            shunt_map_up_right((tgestate_t *)0x10776b);
          }
          else if (bVar1 == 2) {
            shunt_map_right((tgestate_t *)0x107781);
          }
          break;
        case 2:
          if (bVar1 == 3) {
            shunt_map_down((tgestate_t *)0x107799);
          }
          else if ((bVar1 & 1) == 0) {
            shunt_map_right((tgestate_t *)0x1077b2);
          }
          break;
        case 3:
          if (bVar1 == 1) {
            shunt_map_left((tgestate_t *)0x1077ca);
          }
          else if (bVar1 == 3) {
            shunt_map_down_left((tgestate_t *)0x1077e0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void move_map(tgestate_t *state)
{
  const anim_t *anim;               /* was DE */
  uint8_t       animindex;          /* was C */
  direction_t   map_direction;      /* was A */
  uint8_t       move_map_y;         /* was A */
  uint8_t       x,y;                /* was C,B */
  pos8_t        game_window_offset; /* was HL */

  assert(state != NULL);

  if (state->room_index > room_0_OUTDOORS)
    return; /* Don't move the map when indoors. */

  if (state->vischars[0].counter_and_flags & vischar_BYTE7_DONT_MOVE_MAP)
    return; /* Don't move the map when touch() saw contact. */

  anim      = state->vischars[0].anim;
  animindex = state->vischars[0].animindex;
  map_direction = anim->map_direction;
  if (map_direction == 255)
    return; /* Don't move the map if the current animation inhibits it. */

  if (animindex & vischar_ANIMINDEX_REVERSE)
    map_direction ^= 2; /* Exchange up and down directions when reversed. */

  /* Clamp the map position to (0..192,0..124). */

  if (/* DISABLES CODE */ (0))
  {
    /* Equivalent to: */
    switch (map_direction)
    {
      case direction_TOP_LEFT:     x = 192; y = 124; break;
      case direction_TOP_RIGHT:    x =   0; y = 124; break;
      case direction_BOTTOM_RIGHT: x =   0; y =   0; break;
      case direction_BOTTOM_LEFT:  x = 192; y =   0; break;
    }
  }
  else
  {
    y = 124;
    x = 0;
    /* direction_BOTTOM_* - bottom of the map clamp */
    if (map_direction >= direction_BOTTOM_RIGHT)
      y = 0;
    /* direction_*_LEFT - left of the map clamp */
    if (map_direction != direction_TOP_RIGHT &&
        map_direction != direction_BOTTOM_RIGHT)
      x = 192;
  }

  if (state->map_position.x == x || state->map_position.y == y)
    return; /* Don't move. */

  if (map_direction <= direction_TOP_RIGHT)
    /* Either direction_TOP_* */
    state->move_map_y++;
  else
    /* Either direction_BOTTOM_* */
    state->move_map_y--;
  state->move_map_y &= 3;

  move_map_y = state->move_map_y;
  assert(move_map_y <= 3);

  /* Set the game_window_offset. This is used by plot_game_window (which masks
   * off the top and bottom separately). */
  /* Conv: Simplified. */
  switch (move_map_y)
  {
    case 0: game_window_offset.x = 0x00; game_window_offset.y = 0x00; break;
    case 1: game_window_offset.x = 0x30; game_window_offset.y = 0xFF; break;
    case 2: game_window_offset.x = 0x60; game_window_offset.y = 0x00; break;
    case 3: game_window_offset.x = 0x90; game_window_offset.y = 0xFF; break;
  }

  state->game_window_offset = game_window_offset;

  /* These cases check the move_map_y counter to decide when to shunt up/down,
   * and left/right. */
  /* Conv: Inlined. */
  switch (map_direction)
  {
    case direction_TOP_LEFT:
      /* Used when player moves down-right (map is shifted up-left).
       * Pattern: 0..3 => up/left/none/left. */
      if (move_map_y == 0)
        shunt_map_up(state);
      else if (move_map_y & 1)
        shunt_map_left(state);
      break;

    case direction_TOP_RIGHT:
      /* Used when player moves down-left (map is shifted up-right).
       * Pattern: 0..3 => up-right/none/right/none. */
      if (move_map_y == 0)
        shunt_map_up_right(state);
      else if (move_map_y == 2)
        shunt_map_right(state);
      break;

    case direction_BOTTOM_RIGHT:
      /* Used when player moves up-left (map is shifted down-right).
       * Pattern: 0..3 => right/none/right/down. */
      if (move_map_y == 3)
        shunt_map_down(state);
      else if ((move_map_y & 1) == 0)
        shunt_map_right(state);
      break;

    case direction_BOTTOM_LEFT:
      /* Used when player moves up-right (map is shifted down-left).
       * Pattern: 0..3 => none/left/none/down-left. */
      if (move_map_y == 1)
        shunt_map_left(state);
      else if (move_map_y == 3)
        shunt_map_down_left(state);
      break;
  }
}